

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

Parser * __thiscall
Catch::clara::detail::ComposableParserImpl<Catch::clara::detail::ExeName>::operator|
          (Parser *__return_storage_ptr__,ComposableParserImpl<Catch::clara::detail::ExeName> *this,
          Help *other)

{
  undefined1 local_f9;
  Parser local_f8;
  Parser local_90;
  
  local_f8.m_args.
  super__Vector_base<Catch::clara::detail::Arg,_std::allocator<Catch::clara::detail::Arg>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_f8.m_args.
  super__Vector_base<Catch::clara::detail::Arg,_std::allocator<Catch::clara::detail::Arg>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_f8.m_options.
  super__Vector_base<Catch::clara::detail::Opt,_std::allocator<Catch::clara::detail::Opt>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_f8.m_args.
  super__Vector_base<Catch::clara::detail::Arg,_std::allocator<Catch::clara::detail::Arg>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_f8.m_options.
  super__Vector_base<Catch::clara::detail::Opt,_std::allocator<Catch::clara::detail::Opt>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_f8.m_options.
  super__Vector_base<Catch::clara::detail::Opt,_std::allocator<Catch::clara::detail::Opt>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_f8.m_exeName.m_ref.
  super___shared_ptr<Catch::clara::detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_f8.m_exeName.m_ref.
  super___shared_ptr<Catch::clara::detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_f8.m_exeName.m_name.
  super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_f8.super_ParserBase._vptr_ParserBase = (_func_int **)&PTR__Parser_005cda80;
  local_f8.m_exeName.super_ComposableParserImpl<Catch::clara::detail::ExeName>.super_ParserBase.
  _vptr_ParserBase = (ParserBase)&PTR__ExeName_005cd330;
  local_f8.m_exeName.m_name.
  super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<std::__cxx11::string,std::allocator<std::__cxx11::string>,char_const(&)[13]>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_f8.m_exeName.m_name.
              super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
             &local_f8.m_exeName.m_name,
             (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_f9,(char (*) [13])"<executable>");
  local_f8.m_exeName.m_ref.
  super___shared_ptr<Catch::clara::detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_f8.m_exeName.m_ref.
  super___shared_ptr<Catch::clara::detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_f8.m_options.
  super__Vector_base<Catch::clara::detail::Opt,_std::allocator<Catch::clara::detail::Opt>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_f8.m_options.
  super__Vector_base<Catch::clara::detail::Opt,_std::allocator<Catch::clara::detail::Opt>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_f8.m_options.
  super__Vector_base<Catch::clara::detail::Opt,_std::allocator<Catch::clara::detail::Opt>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_f8.m_args.
  super__Vector_base<Catch::clara::detail::Arg,_std::allocator<Catch::clara::detail::Arg>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_f8.m_args.
  super__Vector_base<Catch::clara::detail::Arg,_std::allocator<Catch::clara::detail::Arg>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_f8.m_args.
  super__Vector_base<Catch::clara::detail::Arg,_std::allocator<Catch::clara::detail::Arg>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Parser::operator|(&local_90,&local_f8,(ExeName *)this);
  Parser::operator|(__return_storage_ptr__,&local_90,other);
  local_90.super_ParserBase._vptr_ParserBase = (_func_int **)&PTR__Parser_005cda80;
  std::vector<Catch::clara::detail::Arg,_std::allocator<Catch::clara::detail::Arg>_>::~vector
            (&local_90.m_args);
  std::vector<Catch::clara::detail::Opt,_std::allocator<Catch::clara::detail::Opt>_>::~vector
            (&local_90.m_options);
  local_90.m_exeName.super_ComposableParserImpl<Catch::clara::detail::ExeName>.super_ParserBase.
  _vptr_ParserBase = (ParserBase)&PTR__ExeName_005cd330;
  if (local_90.m_exeName.m_ref.
      super___shared_ptr<Catch::clara::detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_90.m_exeName.m_ref.
               super___shared_ptr<Catch::clara::detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_90.m_exeName.m_name.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_90.m_exeName.m_name.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  local_f8.super_ParserBase._vptr_ParserBase = (_func_int **)&PTR__Parser_005cda80;
  std::vector<Catch::clara::detail::Arg,_std::allocator<Catch::clara::detail::Arg>_>::~vector
            (&local_f8.m_args);
  std::vector<Catch::clara::detail::Opt,_std::allocator<Catch::clara::detail::Opt>_>::~vector
            (&local_f8.m_options);
  local_f8.m_exeName.super_ComposableParserImpl<Catch::clara::detail::ExeName>.super_ParserBase.
  _vptr_ParserBase = (ParserBase)&PTR__ExeName_005cd330;
  if (local_f8.m_exeName.m_ref.
      super___shared_ptr<Catch::clara::detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_f8.m_exeName.m_ref.
               super___shared_ptr<Catch::clara::detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_f8.m_exeName.m_name.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_f8.m_exeName.m_name.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return __return_storage_ptr__;
}

Assistant:

auto ComposableParserImpl<DerivedT>::operator|( T const &other ) const -> Parser {
        return Parser() | static_cast<DerivedT const &>( *this ) | other;
    }